

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O0

void __thiscall psy::C::SemanticModelTester::case0400(SemanticModelTester *this)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  undefined8 uVar4;
  TagType *pTVar5;
  Lexeme *pLVar6;
  string local_d8;
  string local_b8;
  TagDeclarationSymbol *local_98;
  EnumDeclarationSymbol *enun;
  type *semaModel;
  type *enumDeclNode;
  string local_78 [55];
  allocator<char> local_41;
  string local_40;
  undefined1 local_20 [24];
  SemanticModelTester *this_local;
  
  local_20._16_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"enum x { y } ;",&local_41)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"",(allocator<char> *)((long)&enumDeclNode + 7));
  compile<psy::C::EnumDeclarationSyntax>((SemanticModelTester *)local_20,(string *)this,&local_40);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&enumDeclNode + 7));
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  semaModel = (type *)std::
                      get<0ul,psy::C::EnumDeclarationSyntax_const*,psy::C::SemanticModel_const*>
                                ((tuple<const_psy::C::EnumDeclarationSyntax_*,_const_psy::C::SemanticModel_*>
                                  *)local_20);
  enun = (EnumDeclarationSymbol *)
         std::get<1ul,psy::C::EnumDeclarationSyntax_const*,psy::C::SemanticModel_const*>
                   ((tuple<const_psy::C::EnumDeclarationSyntax_*,_const_psy::C::SemanticModel_*> *)
                    local_20);
  local_98 = &SemanticModel::enumFor
                        ((SemanticModel *)
                         (enun->super_TagDeclarationSymbol).super_TypeDeclarationSymbol.
                         super_DeclarationSymbol.super_Symbol._vptr_Symbol,
                         (EnumDeclarationSyntax *)*semaModel)->super_TagDeclarationSymbol;
  if (local_98 == (TagDeclarationSymbol *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar2 = std::operator<<(poVar2,"\t\tExpression is NOT ");
    poVar2 = std::operator<<(poVar2,"true");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\t\t");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,0x2e3);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    uVar4 = __cxa_allocate_exception(1);
    __cxa_throw(uVar4,&TestFailed::typeinfo,0);
  }
  pTVar5 = TagDeclarationSymbol::introducedNewType(local_98);
  pLVar6 = &TagType::tag(pTVar5)->super_Lexeme;
  Lexeme::valueText_abi_cxx11_(&local_b8,pLVar6);
  bVar1 = std::operator==(&local_b8,"x");
  std::__cxx11::string::~string((string *)&local_b8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
  poVar2 = std::operator<<(poVar2,"\t\tActual  : ");
  pTVar5 = TagDeclarationSymbol::introducedNewType(local_98);
  pLVar6 = &TagType::tag(pTVar5)->super_Lexeme;
  Lexeme::valueText_abi_cxx11_(&local_d8,pLVar6);
  poVar2 = std::operator<<(poVar2,(string *)&local_d8);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\t\tExpected: ");
  poVar2 = std::operator<<(poVar2,"x");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\t\t");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,0x2e4);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_d8);
  uVar4 = __cxa_allocate_exception(1);
  __cxa_throw(uVar4,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0400()
{
    auto [enumDeclNode, semaModel] =
            compile<EnumDeclarationSyntax>("enum x { y } ;");

    const EnumDeclarationSymbol* enun = semaModel->enumFor(enumDeclNode);
    PSY_EXPECT_TRUE(enun);
    PSY_EXPECT_EQ_STR(enun->introducedNewType()->tag()->valueText(), "x");
}